

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_concurrent.hpp
# Opt level: O0

void boost::unordered::detail::foa::
     concurrent_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
     ::set_group_access(undefined8 param_1,long param_2)

{
  pointer pgVar1;
  group_access *pgVar2;
  size_t i;
  size_type in_stack_ffffffffffffffd8;
  allocator_type *in_stack_ffffffffffffffe0;
  group_access *this;
  
  pgVar1 = std::allocator_traits<std::allocator<boost::unordered::detail::foa::group_access>_>::
           allocate(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(pointer *)(param_2 + 0x20) = pgVar1;
  for (this = (group_access *)0x0; this < (group_access *)(*(long *)(param_2 + 8) + 1U);
      this = (group_access *)((long)&(this->m).state_.super___atomic_base<unsigned_int>._M_i + 1)) {
    pgVar2 = group_accesses((concurrent_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                             *)0x81fb86);
    memset(pgVar2 + (long)this,0,8);
    group_access::group_access(this);
  }
  return;
}

Assistant:

static void set_group_access(group_access_allocator_type al, concurrent_table_arrays& arrays,
                                 std::false_type /* fancy pointers */) {
        arrays.group_accesses_ = std::allocator_traits<std::remove_cvref_t<decltype(al)>>::allocate(
            al, arrays.groups_size_mask + 1);

        for (std::size_t i = 0; i < arrays.groups_size_mask + 1; ++i) {
            ::new (arrays.group_accesses() + i) group_access();
        }
    }